

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet,Expr *p)

{
  Bitmask BVar1;
  ulong uVar2;
  ulong uVar3;
  Bitmask BVar4;
  Bitmask BVar5;
  
  if ((p->flags & 0x20) == 0 && p->op == 0xa7) {
    BVar1 = sqlite3WhereGetMask(pMaskSet,p->iTable);
    return BVar1;
  }
  if ((p->flags & 0x810000) != 0) {
    return 0;
  }
  if (p->op == 0xb3) {
    uVar2 = sqlite3WhereGetMask(pMaskSet,p->iTable);
  }
  else {
    uVar2 = 0;
  }
  if (p->pLeft != (Expr *)0x0) {
    BVar1 = sqlite3WhereExprUsageNN(pMaskSet,p->pLeft);
    uVar2 = uVar2 | BVar1;
  }
  if (p->pRight == (Expr *)0x0) {
    if ((p->flags >> 0xc & 1) == 0) {
      if ((p->x).pList == (ExprList *)0x0) goto LAB_0018452f;
      uVar3 = sqlite3WhereExprListUsage(pMaskSet,(p->x).pList);
    }
    else {
      if ((p->flags & 0x40) != 0) {
        pMaskSet->bVarSelect = 1;
      }
      uVar3 = exprSelectUsage(pMaskSet,(p->x).pSelect);
    }
  }
  else {
    uVar3 = sqlite3WhereExprUsageNN(pMaskSet,p->pRight);
  }
  uVar2 = uVar2 | uVar3;
LAB_0018452f:
  if (((p->op | 4) == 0xac) && ((p->flags & 0x1000000) != 0)) {
    BVar1 = sqlite3WhereExprListUsage(pMaskSet,((p->y).pWin)->pPartition);
    BVar4 = sqlite3WhereExprListUsage(pMaskSet,((p->y).pWin)->pOrderBy);
    BVar5 = sqlite3WhereExprUsage(pMaskSet,((p->y).pWin)->pFilter);
    uVar2 = BVar5 | uVar2 | BVar4 | BVar1;
  }
  return uVar2;
}

Assistant:

SQLITE_PRIVATE Bitmask sqlite3WhereExprUsageNN(WhereMaskSet *pMaskSet, Expr *p){
  if( p->op==TK_COLUMN && !ExprHasProperty(p, EP_FixedCol) ){
    return sqlite3WhereGetMask(pMaskSet, p->iTable);
  }else if( ExprHasProperty(p, EP_TokenOnly|EP_Leaf) ){
    assert( p->op!=TK_IF_NULL_ROW );
    return 0;
  }
  return sqlite3WhereExprUsageFull(pMaskSet, p);
}